

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::setText(QTextEdit *this,QString *text)

{
  char cVar1;
  QAnyStringView QVar2;
  
  QVar2.m_size = (text->d).size | 0x8000000000000000;
  QVar2.field_0.m_data_utf16 = (text->d).ptr;
  cVar1 = Qt::mightBeRichText(QVar2);
  if (cVar1 != '\0') {
    setHtml(this,text);
    return;
  }
  setPlainText(this,text);
  return;
}

Assistant:

void QTextEdit::setText(const QString &text)
{
    Qt::TextFormat format = Qt::mightBeRichText(text) ? Qt::RichText : Qt::PlainText;
#ifndef QT_NO_TEXTHTMLPARSER
    if (format == Qt::RichText)
        setHtml(text);
    else
#else
    Q_UNUSED(format);
#endif
        setPlainText(text);
}